

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_concurrency_test.cc
# Opt level: O1

void multi_file_write_with_inmem_snap(char *test_name)

{
  fdb_kvs_handle **ptr_handle;
  fdb_commit_opt_t opt;
  fdb_kvs_handle *pfVar1;
  fdb_doc *doc;
  undefined8 uVar2;
  undefined1 *puVar3;
  fdb_status fVar4;
  int iVar5;
  undefined8 extraout_RAX;
  int j;
  long lVar6;
  undefined1 *puVar7;
  int *piVar8;
  undefined8 *puVar9;
  long lVar10;
  int i;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  undefined8 auStack_d90 [2];
  size_t asStack_d80 [2];
  int iStack_d6c;
  long alStack_d68 [11];
  undefined1 auStack_d10 [9];
  undefined1 auStack_d07 [495];
  ulong auStack_b18 [9];
  undefined8 uStack_ad0;
  undefined8 auStack_ac8 [3];
  undefined1 auStack_ab0 [8];
  undefined8 auStack_aa8 [30];
  undefined4 auStack_9b8 [4];
  undefined8 uStack_9a8;
  char acStack_9a0 [256];
  undefined1 auStack_8a0 [8];
  undefined8 auStack_898 [214];
  long alStack_1e8 [13];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined8 local_170;
  void *apvStack_88 [4];
  pthread_t apStack_68 [4];
  undefined1 local_48 [8];
  timeval __test_begin;
  
  __test_begin.tv_usec = (__suseconds_t)test_name;
  gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf ./bigfile* > errorlog.txt");
  uVar11 = 3;
  puVar3 = (undefined1 *)auStack_ac8;
  do {
    puVar7 = puVar3;
    lVar10 = uVar11 * 0x238;
    puVar9 = auStack_ac8 + uVar11 * 0x47;
    *puVar9 = 26000;
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x10544a;
    fdb_get_default_config();
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x105464;
    memcpy(auStack_ab0 + lVar10,&local_180,0xf8);
    auStack_aa8[uVar11 * 0x47] = 0;
    *(undefined8 *)(puVar7 + 0xfffffffffffffff8) = 0x105474;
    fdb_get_default_kvs_config();
    (&uStack_9a8)[uVar11 * 0x47] = local_170;
    auStack_9b8[uVar11 * 0x8e] = local_180;
    auStack_9b8[uVar11 * 0x8e + 1] = uStack_17c;
    auStack_9b8[uVar11 * 0x8e + 2] = uStack_178;
    auStack_9b8[uVar11 * 0x8e + 3] = uStack_174;
    auStack_ac8[uVar11 * 0x47 + 1] = 0xa28;
    auStack_8a0[lVar10] = 1;
    alStack_1e8[uVar11 * 3] = 0x40000000a;
    alStack_1e8[uVar11 * 3 + 1] = (long)(puVar7 + 0xffffffffffffffe0);
    lVar6 = 3;
    do {
      *(undefined8 *)(alStack_1e8[uVar11 * 3 + 1] + lVar6 * 8) = 0;
      bVar13 = lVar6 != 0;
      lVar6 = lVar6 + -1;
    } while (bVar13);
    auStack_898[uVar11 * 0x47] = alStack_1e8 + uVar11 * 3;
    *(undefined8 *)(auStack_ab0 + lVar10 + -8) = 0x104;
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x105510;
    sprintf(acStack_9a0 + lVar10,"%s_%d","./bigfile",uVar11 & 0xffffffff);
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x105528;
    pthread_create(apStack_68 + uVar11,(pthread_attr_t *)0x0,_writer_thread,puVar9);
    bVar13 = uVar11 != 0;
    uVar11 = uVar11 - 1;
    puVar3 = puVar7 + 0xffffffffffffffe0;
  } while (bVar13);
  lVar6 = 0;
  do {
    piVar8 = *(int **)((long)apStack_68 + lVar6);
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x105546;
    pthread_join((pthread_t)piVar8,(void **)((long)apvStack_88 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x105555;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)(puVar7 + 0xffffffffffffffd8) = 0x105566;
    multi_file_write_with_inmem_snap();
    return;
  }
  *(code **)(puVar7 + 0xffffffffffffffd8) = _writer_thread;
  multi_file_write_with_inmem_snap();
  *(undefined1 **)((long)puVar7 + 0xffffffffffffffd8) = &stack0xfffffffffffffff8;
  *(undefined4 **)(puVar7 + 0xffffffffffffffd0) = &local_180;
  *(ulong *)(puVar7 + 0xffffffffffffffc8) = uVar11;
  *(undefined1 **)(puVar7 + 0xffffffffffffffc0) = auStack_ab0 + lVar10;
  *(undefined8 **)(puVar7 + 0xffffffffffffffb8) = puVar9;
  *(undefined8 *)(puVar7 + 0xffffffffffffffb0) = 0x20;
  *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10559a;
  gettimeofday((timeval *)(puVar7 + 0xfffffffffffffda8),(__timezone_ptr_t)0x0);
  *(undefined8 *)(puVar7 + 0xfffffffffffffd60) = 0;
  *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1055bc;
  memcpy((fdb_config *)(puVar7 + 0xfffffffffffffeb8),piVar8 + 6,0xf8);
  *(undefined8 *)(puVar7 + 0xfffffffffffffd98) = *(undefined8 *)(piVar8 + 0x48);
  uVar2 = *(undefined8 *)(piVar8 + 0x46);
  *(undefined8 *)(puVar7 + 0xfffffffffffffd88) = *(undefined8 *)(piVar8 + 0x44);
  *(undefined8 *)(puVar7 + 0xfffffffffffffd90) = uVar2;
  *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1055ec;
  fVar4 = fdb_open((fdb_file_handle **)(puVar7 + 0xfffffffffffffd70),(char *)(piVar8 + 0x4a),
                   (fdb_config *)(puVar7 + 0xfffffffffffffeb8));
  if (fVar4 == FDB_RESULT_SUCCESS) {
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10560f;
    fVar4 = fdb_kvs_open(*(fdb_file_handle **)(puVar7 + 0xfffffffffffffd70),
                         (fdb_kvs_handle **)(puVar7 + 0xfffffffffffffd68),"main",
                         (fdb_kvs_config *)(puVar7 + 0xfffffffffffffd88));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001058c9;
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105632;
    fVar4 = fdb_kvs_open(*(fdb_file_handle **)(puVar7 + 0xfffffffffffffd70),
                         (fdb_kvs_handle **)(puVar7 + 0xfffffffffffffda0),"back",
                         (fdb_kvs_config *)(puVar7 + 0xfffffffffffffd88));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001058ce;
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10564e;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(puVar7 + 0xfffffffffffffd68),logCallbackFunc,
                       piVar8 + 0x4a);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      *(undefined8 *)(puVar7 + 0xfffffffffffffd48) = 0;
      *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105674;
      fVar4 = fdb_doc_create((fdb_doc **)(puVar7 + 0xfffffffffffffd78),(void *)0x0,0,(void *)0x0,0,
                             (void *)0x0,*(size_t *)(puVar7 + 0xfffffffffffffd48));
      if (fVar4 == FDB_RESULT_SUCCESS) {
        puVar9 = *(undefined8 **)(puVar7 + 0xfffffffffffffd78);
        puVar9[4] = puVar7 + 0xfffffffffffffdb8;
        *puVar9 = 0x100;
        *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10569d;
        memset(puVar7 + 0xfffffffffffffdb8,0,0x100);
        if (*piVar8 != 0) {
          uVar11 = (ulong)*piVar8;
          *(undefined4 *)(puVar7 + -0x2a4) = 0;
          *(int **)(puVar7 + 0xfffffffffffffd80) = piVar8;
          do {
            iVar12 = (int)uVar11;
            iVar5 = iVar12 % 0x1a;
            *(undefined4 *)(puVar7 + -0x241) = *(undefined4 *)(prefixes[iVar5] + 7);
            *(undefined8 *)(puVar7 + 0xfffffffffffffdb8) = *(undefined8 *)prefixes[iVar5];
            puVar7[-0x23d] = 0x5f;
            *(int *)(puVar7 + 0xfffffffffffffd48) = iVar12;
            *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105729;
            sprintf(puVar7 + -0x23c,"%8d%8d%8d%8d%8d",uVar11 & 0xffffffff,(long)iVar12,
                    uVar11 & 0xffffffff,uVar11 & 0xffffffff);
            *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105738;
            fVar4 = fdb_set(*(fdb_kvs_handle **)(puVar7 + 0xfffffffffffffd68),
                            *(fdb_doc **)(puVar7 + 0xfffffffffffffd78));
            if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_001058b0:
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058b5;
              _writer_thread();
LAB_001058b5:
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058ba;
              _writer_thread();
LAB_001058ba:
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058bf;
              _writer_thread();
LAB_001058bf:
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058c4;
              _writer_thread();
              goto LAB_001058c4;
            }
            *(int *)(puVar7 + 0xfffffffffffffd48) = iVar12;
            *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105765;
            sprintf(puVar7 + 0xfffffffffffffdb8,"%8d%8d%8d%8d%8d",uVar11 & 0xffffffff,
                    uVar11 & 0xffffffff);
            *(undefined8 *)(puVar7 + -0x23f) = *(undefined8 *)prefixes[iVar5];
            *(undefined4 *)(puVar7 + 0xfffffffffffffdc8) = *(undefined4 *)(prefixes[iVar5] + 7);
            *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105787;
            fVar4 = fdb_set(*(fdb_kvs_handle **)(puVar7 + 0xfffffffffffffd68),
                            *(fdb_doc **)(puVar7 + 0xfffffffffffffd78));
            if (fVar4 != FDB_RESULT_SUCCESS) {
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058b0;
              _writer_thread();
              goto LAB_001058b0;
            }
            lVar6 = *(long *)(puVar7 + 0xfffffffffffffd80);
            if (uVar11 % *(ulong *)(lVar6 + 8) == 0) {
              opt = *(fdb_commit_opt_t *)(lVar6 + 0x228);
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1057b7;
              fVar4 = fdb_commit(*(fdb_file_handle **)(puVar7 + 0xfffffffffffffd70),opt);
              if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_001057c2;
              goto LAB_001058bf;
            }
LAB_001057c2:
            piVar8 = *(int **)(lVar6 + 0x230);
            if ((int)((long)((ulong)(uint)(iVar12 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                     (long)*piVar8) == 0) {
              iVar5 = (*(int *)(puVar7 + -0x2a4) + 1) % piVar8[1];
              lVar6 = *(long *)(piVar8 + 2);
              *(int *)(puVar7 + -0x2a4) = iVar5;
              pfVar1 = *(fdb_kvs_handle **)(lVar6 + (long)iVar5 * 8);
              if (pfVar1 != (fdb_kvs_handle *)0x0) {
                *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1057fb;
                fdb_kvs_close(pfVar1);
              }
              ptr_handle = (fdb_kvs_handle **)(lVar6 + (long)iVar5 * 8);
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105814;
              fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)(puVar7 + 0xfffffffffffffd68),ptr_handle
                                        ,0xffffffffffffffff);
              if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001058b5;
              *(undefined8 *)(puVar7 + 0xfffffffffffffd48) = 0;
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105840;
              fdb_doc_create((fdb_doc **)(puVar7 + 0xfffffffffffffd60),puVar7 + 0xfffffffffffffdb8,
                             0x100,(void *)0x0,0,(void *)0x0,
                             *(size_t *)(puVar7 + 0xfffffffffffffd48));
              pfVar1 = *ptr_handle;
              *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10584e;
              fVar4 = fdb_get(pfVar1,*(fdb_doc **)(puVar7 + 0xfffffffffffffd60));
              if (fVar4 == FDB_RESULT_SUCCESS) {
                *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10585c;
                fdb_doc_free(*(fdb_doc **)(puVar7 + 0xfffffffffffffd60));
                *(undefined8 *)(puVar7 + 0xfffffffffffffd60) = 0;
                goto LAB_00105868;
              }
              goto LAB_001058ba;
            }
LAB_00105868:
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        doc = *(fdb_doc **)(puVar7 + 0xfffffffffffffd78);
        doc->key = (void *)0x0;
        *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x10588d;
        fdb_doc_free(doc);
        *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x105897;
        fdb_close(*(fdb_file_handle **)(puVar7 + 0xfffffffffffffd70));
        return;
      }
      goto LAB_001058d8;
    }
  }
  else {
LAB_001058c4:
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058c9;
    _writer_thread();
LAB_001058c9:
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058ce;
    _writer_thread();
LAB_001058ce:
    *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058d3;
    _writer_thread();
  }
  *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = 0x1058d8;
  _writer_thread();
LAB_001058d8:
  *(code **)(puVar7 + 0xfffffffffffffd40) = main;
  _writer_thread();
  *(undefined8 *)(puVar7 + 0xfffffffffffffd40) = extraout_RAX;
  *(undefined8 *)(puVar7 + 0xfffffffffffffd38) = 0x1058ea;
  multi_file_write_with_inmem_snap("4 writers with in-mem snapshots");
  return;
}

Assistant:

void multi_file_write_with_inmem_snap(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = 4;
    int num_inmem_snaps = 4;
    int inmem_snap_freq = 10;
    int num_docs = NUM_FRUITS*1000;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    struct shared_data *test_data = alca(struct shared_data, num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    void **thread_ret = alca(void *, num_writers);

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].ndocs = num_docs;
        wargs[i].config = fdb_get_default_config();
        wargs[i].config.buffercache_size = 0;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_FRUITS*100;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        test_data[i].num_inmem_snaps = num_inmem_snaps;
        test_data[i].inmem_snap_freq = inmem_snap_freq;
        test_data[i].inmem_snaps = alca(fdb_kvs_handle *, num_inmem_snaps);
        for(int j = num_inmem_snaps - 1; j >=0; --j) {
            test_data[i].inmem_snaps[j] = NULL;
        }
        wargs[i].test = &test_data[i];
        wargs[i].clone_frequency = NUM_FRUITS*10;
        sprintf(wargs[i].test_file_name, "%s_%d", TEST_FILENAME, i);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}